

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

BOOL ReadProcessMemory(HANDLE hProcess,LPCVOID lpBaseAddress,LPVOID lpBuffer,SIZE_T nSize,
                      SIZE_T *lpNumberOfBytesRead)

{
  long lVar1;
  uint __errnum;
  FILE *__stream;
  DWORD processId;
  DWORD DVar2;
  BOOL BVar3;
  CPalThread *pThread;
  SIZE_T SVar4;
  ulong uVar5;
  void *pvMem;
  uint *puVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  SIZE_T local_48;
  Volatile<unsigned_long> numberOfBytesRead;
  BOOL local_34;
  Volatile<int> ret;
  
  local_34 = 0;
  local_48 = 0;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    processId = PROCGetProcessIDFromHandle(hProcess);
    if (processId == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014ca8c;
      SetLastError(6);
    }
    else {
      DVar2 = GetCurrentProcessId();
      if (DVar2 == processId) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014ca8c;
        if (nSize != 0) {
          SVar4 = 0;
          do {
            *(undefined1 *)((long)lpBuffer + SVar4) = *(undefined1 *)((long)lpBaseAddress + SVar4);
            SVar4 = SVar4 + 1;
          } while (nSize != SVar4);
        }
        local_34 = 1;
        local_48 = nSize;
      }
      else {
        BVar3 = DBGAttachProcess(pThread,hProcess,processId);
        if (BVar3 != 0) {
          uVar5 = (ulong)((uint)lpBaseAddress & 3);
          lVar10 = ((uVar5 + nSize >> 2) + 1) - (ulong)((uVar5 + nSize & 3) == 0);
          pvMem = CorUnix::InternalMalloc(lVar10 * 4);
          if (pvMem == (void *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014ca8c;
            SetLastError(8);
          }
          else {
            if (lVar10 != 0) {
              puVar6 = (uint *)__errno_location();
              lVar9 = 0;
              do {
                lVar1 = (long)lpBaseAddress + (lVar9 - uVar5);
                *puVar6 = 0;
                lVar7 = ptrace(PTRACE_PEEKDATA,(ulong)processId,lVar1,0);
                *(int *)((long)pvMem + lVar9) = (int)lVar7;
                if (((int)lVar7 == -1) && (*puVar6 != 0)) {
                  if (*puVar6 == 0xe) {
                    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014ca8c;
                    strerror(0xe);
                    DVar2 = 299;
                    if (lVar9 == 0) {
                      DVar2 = 5;
                    }
                    SetLastError(DVar2);
                  }
                  else {
                    fprintf(_stderr,"] %s %s:%d","ReadProcessMemory",
                            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                            ,0x317);
                    __stream = _stderr;
                    __errnum = *puVar6;
                    pcVar8 = strerror(__errnum);
                    fprintf(__stream,
                            "ptrace(PT_READ_D, pid:%d, addr:%p, data:0) failed errno=%d (%s)\n",
                            (ulong)processId,lVar1,(ulong)__errnum,pcVar8);
                    SetLastError(0x54f);
                  }
                  goto LAB_0014ca3d;
                }
                lVar9 = lVar9 + 4;
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
            }
            memcpy(lpBuffer,(void *)((long)pvMem + uVar5),nSize);
            local_34 = 1;
            local_48 = nSize;
LAB_0014ca3d:
            CorUnix::InternalFree(pvMem);
          }
          BVar3 = DBGDetachProcess(pThread,hProcess,processId);
          if (BVar3 == 0) {
            local_34 = 0;
          }
        }
      }
    }
    if (lpNumberOfBytesRead != (SIZE_T *)0x0) {
      *lpNumberOfBytesRead = local_48;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return local_34;
    }
  }
LAB_0014ca8c:
  abort();
}

Assistant:

BOOL
PALAPI
ReadProcessMemory(
           IN HANDLE hProcess,
           IN LPCVOID lpBaseAddress,
           IN LPVOID lpBuffer,
           IN SIZE_T nSize,
           OUT SIZE_T * lpNumberOfBytesRead
           )
{
    CPalThread *pThread;
    DWORD processId;
    Volatile<BOOL> ret = FALSE;
    Volatile<SIZE_T> numberOfBytesRead = 0;
#if HAVE_VM_READ
    kern_return_t result;
    vm_map_t task;
    LONG_PTR bytesToRead;
#elif HAVE_PROCFS_CTL
    int fd;
    char memPath[64];
    off_t offset;
#elif !HAVE_TTRACE
    SIZE_T nbInts;
    int* ptrInt;
    int* lpTmpBuffer;
#endif
#if !HAVE_PROCFS_CTL && !HAVE_TTRACE
    int* lpBaseAddressAligned;
    SIZE_T offset;
#endif  // !HAVE_PROCFS_CTL && !HAVE_TTRACE

    PERF_ENTRY(ReadProcessMemory);
    ENTRY("ReadProcessMemory (hProcess=%p,lpBaseAddress=%p, lpBuffer=%p, "
          "nSize=%u, lpNumberOfBytesRead=%p)\n",hProcess,lpBaseAddress,
          lpBuffer, (unsigned int)nSize, lpNumberOfBytesRead);

    pThread = InternalGetCurrentThread();

    if (!(processId = PROCGetProcessIDFromHandle(hProcess)))
    {
        ERROR("Invalid process handler hProcess:%p.",hProcess);
        SetLastError(ERROR_INVALID_HANDLE);
        goto EXIT;
    }

    // Check if the read request is for the current process.
    // We don't need ptrace in that case.
    if (GetCurrentProcessId() == processId)
    {
        TRACE("We are in the same process, so ptrace is not needed\n");

        struct Param
        {
            LPCVOID lpBaseAddress;
            LPVOID lpBuffer;
            SIZE_T nSize;
            SIZE_T numberOfBytesRead;
            BOOL ret;
        } param;
        param.lpBaseAddress = lpBaseAddress;
        param.lpBuffer = lpBuffer;
        param.nSize = nSize;
        param.numberOfBytesRead = numberOfBytesRead;
        param.ret = ret;

        {
            SIZE_T i;

            // Seg fault in memcpy can't be caught
            // so we simulate the memcpy here

            for (i = 0; i<param.nSize; i++)
            {
                *((char*)(param.lpBuffer)+i) = *((char*)(param.lpBaseAddress)+i);
            }

            param.numberOfBytesRead = param.nSize;
            param.ret = TRUE;
        }

        numberOfBytesRead = param.numberOfBytesRead;
        ret = param.ret;
        goto EXIT;
    }

#if HAVE_VM_READ
    result = task_for_pid(mach_task_self(), processId, &task);
    if (result != KERN_SUCCESS)
    {
        ERROR("No Mach task for pid %d: %d\n", processId, ret.Load());
        SetLastError(ERROR_INVALID_HANDLE);
        goto EXIT;
    }
    // vm_read_overwrite usually requires that the address be page-aligned
    // and the size be a multiple of the page size.  We can't differentiate
    // between the cases in which that's required and those in which it
    // isn't, so we do it all the time.
    lpBaseAddressAligned = (int*)((SIZE_T) lpBaseAddress & ~VIRTUAL_PAGE_MASK);
    offset = ((SIZE_T) lpBaseAddress & VIRTUAL_PAGE_MASK);
    char *data;
    data = (char*)alloca(VIRTUAL_PAGE_SIZE);
    while (nSize > 0)
    {
        vm_size_t bytesRead;

        bytesToRead = VIRTUAL_PAGE_SIZE - offset;
        if (bytesToRead > (LONG_PTR)nSize)
        {
            bytesToRead = nSize;
        }
        bytesRead = VIRTUAL_PAGE_SIZE;
        result = vm_read_overwrite(task, (vm_address_t) lpBaseAddressAligned,
                                   VIRTUAL_PAGE_SIZE, (vm_address_t) data, &bytesRead);
        if (result != KERN_SUCCESS || bytesRead != VIRTUAL_PAGE_SIZE)
        {
            ERROR("vm_read_overwrite failed for %d bytes from %p in %d: %d\n",
                  VIRTUAL_PAGE_SIZE, (char *) lpBaseAddressAligned, task, result);
            if (result <= KERN_RETURN_MAX)
            {
                SetLastError(ERROR_INVALID_ACCESS);
            }
            else
            {
                SetLastError(ERROR_INTERNAL_ERROR);
            }
            goto EXIT;
        }
        memcpy((LPSTR)lpBuffer + numberOfBytesRead, data + offset, bytesToRead);
        numberOfBytesRead.Store(numberOfBytesRead.Load() + bytesToRead);
        lpBaseAddressAligned = (int*)((char*)lpBaseAddressAligned + VIRTUAL_PAGE_SIZE);
        nSize -= bytesToRead;
        offset = 0;
    }
    ret = TRUE;
#else   // HAVE_VM_READ
#if HAVE_PROCFS_CTL
    snprintf(memPath, sizeof(memPath), "/proc/%u/%s", processId, PROCFS_MEM_NAME);
    fd = InternalOpen(memPath, O_RDONLY);
    if (fd == -1)
    {
        ERROR("Failed to open %s\n", memPath);
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    //
    // off_t may be greater in size than void*, so first cast to
    // an unsigned type to ensure that no sign extension takes place
    //

    offset = (off_t) (UINT_PTR) lpBaseAddress;

    if (lseek(fd, offset, SEEK_SET) == -1)
    {
        ERROR("Failed to seek to base address\n");
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    numberOfBytesRead = read(fd, lpBuffer, nSize);
    ret = TRUE;

#else   // HAVE_PROCFS_CTL
    // Attach the process before calling ttrace/ptrace otherwise it fails.
    if (DBGAttachProcess(pThread, hProcess, processId))
    {
#if HAVE_TTRACE
        if (ttrace(TT_PROC_RDDATA, processId, 0, (__uint64_t)lpBaseAddress, (__uint64_t)nSize, (__uint64_t)lpBuffer) == -1)
        {
            if (errno == EFAULT)
            {
                ERROR("ttrace(TT_PROC_RDDATA, pid:%d, 0, addr:%p, data:%d, addr2:%d) failed"
                      " errno=%d (%s)\n", processId, lpBaseAddress, (int)nSize, lpBuffer,
                      errno, strerror(errno));

                SetLastError(ERROR_ACCESS_DENIED);
            }
            else
            {
                ASSERT("ttrace(TT_PROC_RDDATA, pid:%d, 0, addr:%p, data:%d, addr2:%d) failed"
                      " errno=%d (%s)\n", processId, lpBaseAddress, (int)nSize, lpBuffer,
                      errno, strerror(errno));
                SetLastError(ERROR_INTERNAL_ERROR);
            }

            goto CLEANUP1;
        }

        numberOfBytesRead = nSize;
        ret = TRUE;

#else   // HAVE_TTRACE

        offset = (SIZE_T)lpBaseAddress % sizeof(int);
        lpBaseAddressAligned =  (int*)((char*)lpBaseAddress - offset);
        nbInts = (nSize + offset)/sizeof(int) +
                 ((nSize + offset)%sizeof(int) ? 1:0);

        /* before transferring any data to lpBuffer we should make sure that all
           data is accessible for read. so we need to use a temp buffer for that.*/
        if (!(lpTmpBuffer = (int*)InternalMalloc((nbInts * sizeof(int)))))
        {
            ERROR("Insufficient memory available !\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto CLEANUP1;
        }

        for (ptrInt = lpTmpBuffer; nbInts; ptrInt++,
            lpBaseAddressAligned++, nbInts--)
        {
            errno = 0;
            *ptrInt =
                PAL_PTRACE(PAL_PT_READ_D, processId, lpBaseAddressAligned, 0);
            if (*ptrInt == -1 && errno)
            {
                if (errno == EFAULT)
                {
                    ERROR("ptrace(PT_READ_D, pid:%d, addr:%p, data:0) failed"
                          " errno=%d (%s)\n", processId, lpBaseAddressAligned,
                          errno, strerror(errno));

                    SetLastError(ptrInt == lpTmpBuffer ? ERROR_ACCESS_DENIED :
                                                         ERROR_PARTIAL_COPY);
                }
                else
                {
                    ASSERT("ptrace(PT_READ_D, pid:%d, addr:%p, data:0) failed"
                          " errno=%d (%s)\n", processId, lpBaseAddressAligned,
                          errno, strerror(errno));
                    SetLastError(ERROR_INTERNAL_ERROR);
                }

                goto CLEANUP2;
            }
        }

        /* transfer data from temp buffer to lpBuffer */
        memcpy( (char *)lpBuffer, ((char*)lpTmpBuffer) + offset, nSize);
        numberOfBytesRead = nSize;
        ret = TRUE;
#endif // HAVE_TTRACE
    }
    else
    {
        /* Failed to attach processId */
        goto EXIT;
    }
#endif  // HAVE_PROCFS_CTL

#if HAVE_PROCFS_CTL
PROCFSCLEANUP:
    if (fd != -1)
    {
        close(fd);
    }
#elif !HAVE_TTRACE
CLEANUP2:
    if (lpTmpBuffer)
    {
        InternalFree(lpTmpBuffer);
    }
#endif  // !HAVE_TTRACE

#if !HAVE_PROCFS_CTL
CLEANUP1:
    if (!DBGDetachProcess(pThread, hProcess, processId))
    {
        /* Failed to detach processId */
        ret = FALSE;
    }
#endif  // HAVE_PROCFS_CTL
#endif  // HAVE_VM_READ

EXIT:
    if (lpNumberOfBytesRead)
    {
        *lpNumberOfBytesRead = numberOfBytesRead;
    }
    LOGEXIT("ReadProcessMemory returns BOOL %d\n", ret.Load());
    PERF_EXIT(ReadProcessMemory);
    return ret;
}